

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_Thing_Hate(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  FState *newstate;
  AActor *pAVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  AActor **ppAVar5;
  AActor *pAVar6;
  AActor *pAVar7;
  AActor *this;
  AActor *pAVar8;
  AActor *pAVar9;
  AActor *pAVar10;
  
  if (arg1 == 0) {
    pAVar10 = (AActor *)0x0;
LAB_0053570d:
    bVar2 = false;
  }
  else {
    bVar2 = true;
    for (pAVar10 = AActor::TIDHash[arg1 & 0x7f]; pAVar10 != (AActor *)0x0; pAVar10 = pAVar10->inext)
    {
      if ((((pAVar10->tid == arg1) && (((pAVar10->flags).Value & 4) != 0)) && (0 < pAVar10->health))
         && (((pAVar10->flags2).Value & 0x10000000) == 0)) goto LAB_0053570d;
    }
    pAVar10 = (AActor *)0x0;
  }
  if (arg0 == 0) {
    if (it == (AActor *)0x0) {
      iVar3 = 1;
    }
    else {
      iVar3 = 0;
      if (it->player == (player_t *)0x0) {
        this = it;
        pAVar8 = (AActor *)0x0;
LAB_0053578a:
        pAVar6 = pAVar10;
        do {
          newstate = this->SeeState;
          pAVar9 = pAVar6;
          if (newstate != (FState *)0x0) {
            if (arg2 == 0) {
LAB_00535856:
              uVar4 = (this->flags3).Value & 0xffffff7f;
            }
            else {
              this->TIDtoHate = arg1;
              (this->LastLookActor).field_0.p = (AActor *)0x0;
              if (arg1 != 0) {
                pAVar9 = (this->target).field_0.p;
                if ((pAVar9 != (AActor *)0x0) &&
                   ((((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0 ||
                    (pAVar9->tid != arg1)))) {
                  (this->target).field_0.p = (AActor *)0x0;
                }
                pAVar9 = (this->lastenemy).field_0.p;
                if ((pAVar9 != (AActor *)0x0) &&
                   ((((pAVar9->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0 ||
                    (pAVar9->tid != arg1)))) {
                  (this->lastenemy).field_0.p = (AActor *)0x0;
                }
              }
              if ((6 < (uint)arg2) || ((0x54U >> (arg2 & 0x1fU) & 1) == 0)) goto LAB_00535856;
              uVar4 = (this->flags3).Value | 0x80;
            }
            if (arg2 - 3U < 2) {
              (this->flags3).Value = uVar4 | 0x80000000;
LAB_00535890:
              *(byte *)&(this->flags4).Value = (byte)(this->flags4).Value & 0xfe;
            }
            else {
              (this->flags3).Value = uVar4 & 0x7fffffff;
              if (1 < arg2 - 5U) goto LAB_00535890;
              *(byte *)&(this->flags4).Value = (byte)(this->flags4).Value | 1;
            }
            pAVar9 = it;
            if (arg1 != 0) {
              pAVar9 = pAVar6;
              if (bVar2) {
                pAVar9 = (AActor *)0x0;
              }
              if (!(bool)(arg2 == 0 | bVar2)) {
LAB_005358c3:
                do {
                  do {
                    ppAVar5 = &pAVar10->inext;
                    if (pAVar10 == (AActor *)0x0) {
                      ppAVar5 = AActor::TIDHash + (arg1 & 0x7f);
                    }
                    pAVar10 = (AActor *)0x0;
                    pAVar6 = *ppAVar5;
                  } while (*ppAVar5 == (AActor *)0x0);
                  do {
                    pAVar10 = pAVar6;
                    if (pAVar10->tid == arg1) {
                      if ((((pAVar10 == this) || (((pAVar10->flags).Value & 4) == 0)) ||
                          (pAVar10->health < 1)) ||
                         (pAVar9 = pAVar10, ((pAVar10->flags2).Value & 0x10000000) != 0))
                      goto LAB_005358c3;
                      goto LAB_00535922;
                    }
                    pAVar6 = pAVar10->inext;
                  } while (pAVar10->inext != (AActor *)0x0);
                  pAVar10 = (AActor *)0x0;
                } while( true );
              }
            }
            if (pAVar9 == (AActor *)0x0) {
              pAVar9 = (AActor *)0x0;
            }
            else {
LAB_00535922:
              if (pAVar9 != this) {
                if (arg2 == 0) {
                  pAVar6 = (this->target).field_0.p;
                  pAVar7 = pAVar6;
LAB_00535996:
                  if ((pAVar7 != (AActor *)0x0) &&
                     (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0)) {
                    (this->lastenemy).field_0.p = pAVar6;
                  }
                  (this->target).field_0.p = pAVar9;
                  if ((((this->flags2).Value & 0x10000000) == 0) && (0 < this->health)) {
                    AActor::SetState(this,newstate,false);
                  }
                }
                else {
                  pAVar1 = (this->goal).field_0.p;
                  if (pAVar1 != (AActor *)0x0) {
                    if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
                      pAVar6 = (this->target).field_0.p;
                      if (pAVar6 == (AActor *)0x0) {
LAB_00535970:
                        pAVar7 = (AActor *)0x0;
                      }
                      else {
                        pAVar7 = pAVar6;
                        if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
                          (this->target).field_0.p = (AActor *)0x0;
                          pAVar6 = (AActor *)0x0;
                          goto LAB_00535970;
                        }
                      }
                      if (pAVar7 != pAVar1) goto LAB_00535996;
                    }
                    else {
                      (this->goal).field_0.p = (AActor *)0x0;
                    }
                  }
                }
              }
            }
          }
          if (arg0 == 0) {
            return 1;
          }
          ppAVar5 = &pAVar8->inext;
          if (pAVar8 == (AActor *)0x0) {
            ppAVar5 = AActor::TIDHash + (arg0 & 0x7f);
          }
          this = *ppAVar5;
          while( true ) {
            if (this == (AActor *)0x0) {
              return 1;
            }
            if (((this->tid == arg0) && (0 < this->health)) &&
               (pAVar8 = this, pAVar6 = pAVar9, ((this->flags).Value & 4) != 0)) break;
            this = this->inext;
          }
        } while( true );
      }
    }
  }
  else {
    iVar3 = 1;
    for (this = AActor::TIDHash[arg0 & 0x7f]; this != (AActor *)0x0; this = this->inext) {
      if (((this->tid == arg0) && (0 < this->health)) &&
         (pAVar8 = this, ((this->flags).Value & 4) != 0)) goto LAB_0053578a;
    }
  }
  return iVar3;
}

Assistant:

FUNC(LS_Thing_Hate)
// Thing_Hate (hater, hatee, group/"xray"?)
{
	FActorIterator haterIt (arg0);
	AActor *hater, *hatee = NULL;
	FActorIterator hateeIt (arg1);
	bool nothingToHate = false;

	if (arg1 != 0)
	{
		while ((hatee = hateeIt.Next ()))
		{
			if (hatee->flags & MF_SHOOTABLE	&&	// can't hate nonshootable things
				hatee->health > 0 &&			// can't hate dead things
				!(hatee->flags2 & MF2_DORMANT))	// can't target dormant things
			{
				break;
			}
		}
		if (hatee == NULL)
		{ // Nothing to hate
			nothingToHate = true;
		}
	}

	if (arg0 == 0)
	{
		if (it != NULL && it->player != NULL)
		{
			// Players cannot have their attitudes set
			return false;
		}
		else
		{
			hater = it;
		}
	}
	else
	{
		while ((hater = haterIt.Next ()))
		{
			if (hater->health > 0 && hater->flags & MF_SHOOTABLE)
			{
				break;
			}
		}
	}
	while (hater != NULL)
	{
		// Can't hate if can't attack.
		if (hater->SeeState != NULL)
		{
			// If hating a group of things, record the TID and NULL
			// the target (if its TID doesn't match). A_Look will
			// find an appropriate thing to go chase after.
			if (arg2 != 0)
			{
				hater->TIDtoHate = arg1;
				hater->LastLookActor = NULL;

				// If the TID to hate is 0, then don't forget the target and
				// lastenemy fields.
				if (arg1 != 0)
				{
					if (hater->target != NULL && hater->target->tid != arg1)
					{
						hater->target = NULL;
					}
					if (hater->lastenemy != NULL && hater->lastenemy->tid != arg1)
					{
						hater->lastenemy = NULL;
					}
				}
			}
			// Hate types for arg2:
			//
			// 0 - Just hate one specific actor
			// 1 - Hate actors with given TID and attack players when shot
			// 2 - Same as 1, but will go after enemies without seeing them first
			// 3 - Hunt actors with given TID and also players
			// 4 - Same as 3, but will go after monsters without seeing them first
			// 5 - Hate actors with given TID and ignore player attacks
			// 6 - Same as 5, but will go after enemies without seeing them first

			// Note here: If you use Thing_Hate (tid, 0, 2), you can make
			// a monster go after a player without seeing him first.
			if (arg2 == 2 || arg2 == 4 || arg2 == 6)
			{
				hater->flags3 |= MF3_NOSIGHTCHECK;
			}
			else
			{
				hater->flags3 &= ~MF3_NOSIGHTCHECK;
			}
			if (arg2 == 3 || arg2 == 4)
			{
				hater->flags3 |= MF3_HUNTPLAYERS;
			}
			else
			{
				hater->flags3 &= ~MF3_HUNTPLAYERS;
			}
			if (arg2 == 5 || arg2 == 6)
			{
				hater->flags4 |= MF4_NOHATEPLAYERS;
			}
			else
			{
				hater->flags4 &= ~MF4_NOHATEPLAYERS;
			}

			if (arg1 == 0)
			{
				hatee = it;
			}
			else if (nothingToHate)
			{
				hatee = NULL;
			}
			else if (arg2 != 0)
			{
				do
				{
					hatee = hateeIt.Next ();
				}
				while ( hatee == NULL ||
						hatee == hater ||					// can't hate self
						!(hatee->flags & MF_SHOOTABLE) ||	// can't hate nonshootable things
						hatee->health <= 0 ||				// can't hate dead things
						(hatee->flags2 & MF2_DORMANT));	
			}

			if (hatee != NULL && hatee != hater && (arg2 == 0 || (hater->goal != NULL && hater->target != hater->goal)))
			{
				if (hater->target)
				{
					hater->lastenemy = hater->target;
				}
				hater->target = hatee;
				if (!(hater->flags2 & MF2_DORMANT))
				{
					if (hater->health > 0) hater->SetState (hater->SeeState);
				}
			}
		}
		if (arg0 != 0)
		{
			while ((hater = haterIt.Next ()))
			{
				if (hater->health > 0 && hater->flags & MF_SHOOTABLE)
				{
					break;
				}
			}
		}
		else
		{
			hater = NULL;
		}
	}
	return true;
}